

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testing.cpp
# Opt level: O3

int testingMul(void)

{
  anon_unknown_dwarf_3a15 *this;
  bool bVar1;
  int iVar2;
  long lVar3;
  size_t i;
  size_t res;
  BN k_o;
  BN k_m;
  BN f_m;
  BN c_m;
  BN mul;
  BN bn2;
  BN bn1;
  undefined1 local_158 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  string *local_138;
  size_t local_130;
  size_t local_128;
  long local_120;
  BN local_118;
  BN local_100;
  BN local_e8;
  BN local_d0;
  BN local_b8;
  BN local_a0;
  BN local_88;
  size_t asStack_70 [8];
  
  this = (anon_unknown_dwarf_3a15 *)(local_158 + 0x10);
  lVar3 = 0;
  do {
    local_128 = *(size_t *)((long)asStack_70 + lVar3);
    local_130 = *(size_t *)((long)asStack_70 + lVar3 + 8);
    i = 0;
    local_120 = lVar3;
    do {
      iVar2 = rand();
      BN::makeRandom(&local_88,(long)(iVar2 % (int)local_128 + 1));
      iVar2 = rand();
      BN::makeRandom(&local_a0,(long)(iVar2 % (int)local_130 + 1));
      BN::operator*(&local_b8,&local_88,&local_a0);
      BN::classicMultiplication(&local_d0,&local_88,&local_a0);
      BN::fastMultiplication(&local_e8,&local_88,&local_a0);
      BN::karatsubaMultiplication(&local_100,&local_88,&local_a0);
      BN::karatsubaMultiplication(&local_118,&local_88,&local_a0);
      bVar1 = BN::operator!=(&local_b8,&local_d0);
      if ((((bVar1) || (bVar1 = BN::operator!=(&local_b8,&local_e8), bVar1)) ||
          (bVar1 = BN::operator!=(&local_b8,&local_100), bVar1)) ||
         (bVar1 = BN::operator!=(&local_b8,&local_118), bVar1)) {
        local_148._M_local_buf[2] = '1';
        local_148._M_allocated_capacity._0_2_ = 0x6e62;
        local_158._8_8_ = 3;
        local_148._M_local_buf[3] = '\0';
        local_158._0_8_ = this;
        anon_unknown.dwarf_3a15::printBN(this,(string *)0x3,&local_88);
        if ((anon_unknown_dwarf_3a15 *)local_158._0_8_ != this) {
          operator_delete((void *)local_158._0_8_);
        }
        local_148._M_local_buf[2] = '2';
        local_148._M_allocated_capacity._0_2_ = 0x6e62;
        local_158._8_8_ = 3;
        local_148._M_local_buf[3] = '\0';
        local_158._0_8_ = this;
        anon_unknown.dwarf_3a15::printBN(this,(string *)0x3,&local_88);
        if ((anon_unknown_dwarf_3a15 *)local_158._0_8_ != this) {
          operator_delete((void *)local_158._0_8_);
        }
        local_138 = (string *)0x14;
        local_158._0_8_ = this;
        local_158._0_8_ = std::__cxx11::string::_M_create((ulong *)local_158,(ulong)&local_138);
        local_148._M_allocated_capacity._0_2_ = SUB82(local_138,0);
        local_148._M_local_buf[2] = (char)((ulong)local_138 >> 0x10);
        local_148._M_local_buf[3] = (char)((ulong)local_138 >> 0x18);
        local_148._M_allocated_capacity._4_2_ = (undefined2)((ulong)local_138 >> 0x20);
        local_148._M_allocated_capacity._6_2_ = (undefined2)((ulong)local_138 >> 0x30);
        *(undefined8 *)local_158._0_8_ = 0x6e62202a20316e62;
        *(undefined8 *)(local_158._0_8_ + 8) = 0x74617265706f2032;
        *(undefined4 *)(local_158._0_8_ + 0x10) = 0x2a20726f;
        local_158._8_8_ = local_138;
        *(anon_unknown_dwarf_3a15 *)(local_158._0_8_ + (long)local_138) =
             (anon_unknown_dwarf_3a15)0x0;
        anon_unknown.dwarf_3a15::printBN
                  ((anon_unknown_dwarf_3a15 *)local_158._0_8_,local_138,&local_b8);
        if ((anon_unknown_dwarf_3a15 *)local_158._0_8_ != this) {
          operator_delete((void *)local_158._0_8_);
        }
        local_138 = (string *)0x11;
        local_158._0_8_ = this;
        local_158._0_8_ = std::__cxx11::string::_M_create((ulong *)local_158,(ulong)&local_138);
        local_148._M_allocated_capacity._0_2_ = SUB82(local_138,0);
        local_148._M_local_buf[2] = (char)((ulong)local_138 >> 0x10);
        local_148._M_local_buf[3] = (char)((ulong)local_138 >> 0x18);
        local_148._M_allocated_capacity._4_2_ = (undefined2)((ulong)local_138 >> 0x20);
        local_148._M_allocated_capacity._6_2_ = (undefined2)((ulong)local_138 >> 0x30);
        *(undefined8 *)local_158._0_8_ = 0x6e62202a20316e62;
        *(undefined8 *)(local_158._0_8_ + 8) = 0x697373616c632032;
        *(anon_unknown_dwarf_3a15 *)(local_158._0_8_ + 0x10) = (anon_unknown_dwarf_3a15)0x63;
        local_158._8_8_ = local_138;
        *(anon_unknown_dwarf_3a15 *)(local_158._0_8_ + (long)local_138) =
             (anon_unknown_dwarf_3a15)0x0;
        anon_unknown.dwarf_3a15::printBN
                  ((anon_unknown_dwarf_3a15 *)local_158._0_8_,local_138,&local_d0);
        if ((anon_unknown_dwarf_3a15 *)local_158._0_8_ != this) {
          operator_delete((void *)local_158._0_8_);
        }
        local_148._8_6_ = 0x747361662032;
        local_148._M_allocated_capacity._0_2_ = 0x6e62;
        local_148._M_local_buf[2] = '1';
        local_148._M_local_buf[3] = ' ';
        local_148._M_allocated_capacity._4_2_ = 0x202a;
        local_148._M_allocated_capacity._6_2_ = 0x6e62;
        local_158._8_8_ = 0xe;
        local_148._M_local_buf[0xe] = '\0';
        local_158._0_8_ = this;
        anon_unknown.dwarf_3a15::printBN(this,(string *)0xe,&local_e8);
        if ((anon_unknown_dwarf_3a15 *)local_158._0_8_ != this) {
          operator_delete((void *)local_158._0_8_);
        }
        local_138 = (string *)0x13;
        local_158._0_8_ = this;
        local_158._0_8_ = std::__cxx11::string::_M_create((ulong *)local_158,(ulong)&local_138);
        local_148._M_allocated_capacity._0_2_ = SUB82(local_138,0);
        local_148._M_local_buf[2] = (char)((ulong)local_138 >> 0x10);
        local_148._M_local_buf[3] = (char)((ulong)local_138 >> 0x18);
        local_148._M_allocated_capacity._4_2_ = (undefined2)((ulong)local_138 >> 0x20);
        local_148._M_allocated_capacity._6_2_ = (undefined2)((ulong)local_138 >> 0x30);
        *(undefined8 *)local_158._0_8_ = 0x6e62202a20316e62;
        *(undefined8 *)(local_158._0_8_ + 8) = 0x73746172616b2032;
        *(undefined4 *)(local_158._0_8_ + 0xf) = 0x61627573;
        local_158._8_8_ = local_138;
        *(anon_unknown_dwarf_3a15 *)(local_158._0_8_ + (long)local_138) =
             (anon_unknown_dwarf_3a15)0x0;
        anon_unknown.dwarf_3a15::printBN
                  ((anon_unknown_dwarf_3a15 *)local_158._0_8_,local_138,&local_100);
        if ((anon_unknown_dwarf_3a15 *)local_158._0_8_ != this) {
          operator_delete((void *)local_158._0_8_);
        }
        local_138 = (string *)0x15;
        local_158._0_8_ = this;
        local_158._0_8_ = std::__cxx11::string::_M_create((ulong *)local_158,(ulong)&local_138);
        local_148._M_allocated_capacity._0_2_ = SUB82(local_138,0);
        local_148._M_local_buf[2] = (char)((ulong)local_138 >> 0x10);
        local_148._M_local_buf[3] = (char)((ulong)local_138 >> 0x18);
        local_148._M_allocated_capacity._4_2_ = (undefined2)((ulong)local_138 >> 0x20);
        local_148._M_allocated_capacity._6_2_ = (undefined2)((ulong)local_138 >> 0x30);
        *(undefined8 *)local_158._0_8_ = 0x6e62202a20316e62;
        *(undefined8 *)(local_158._0_8_ + 8) = 0x73746172616b2032;
        *(undefined8 *)(local_158._0_8_ + 0xd) = 0x6f5f616275737461;
        local_158._8_8_ = local_138;
        *(anon_unknown_dwarf_3a15 *)(local_158._0_8_ + (long)local_138) =
             (anon_unknown_dwarf_3a15)0x0;
        anon_unknown.dwarf_3a15::printBN
                  ((anon_unknown_dwarf_3a15 *)local_158._0_8_,local_138,&local_118);
        if ((anon_unknown_dwarf_3a15 *)local_158._0_8_ != this) {
          operator_delete((void *)local_158._0_8_);
        }
        res = 1;
        bVar1 = false;
      }
      else {
        bVar1 = true;
        res = 0;
      }
      if (local_118.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_118.ba.
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_100.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_100.ba.
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_e8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_e8.ba.
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_d0.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_d0.ba.
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_b8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b8.ba.
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_a0.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a0.ba.
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_88.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_88.ba.
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (!bVar1) {
        local_158._0_8_ = this;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"Multiplication","");
        anon_unknown.dwarf_3a15::printTestError((string *)local_158,local_128,local_130,i,res);
        if ((anon_unknown_dwarf_3a15 *)local_158._0_8_ != this) {
          operator_delete((void *)local_158._0_8_);
        }
        return 1;
      }
      i = i + 1;
    } while ((int)i != 100000);
    lVar3 = local_120 + 0x10;
    if (lVar3 == 0x40) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Multiple test: OK",0x11);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
      std::ostream::put('\x10');
      std::ostream::flush();
      return 0;
    }
  } while( true );
}

Assistant:

int testingMul() {
    for (auto sizes : defaultSizes()) {
        size_t max1 = sizes.first;
        size_t max2 = sizes.second;
        for(int i = 0; i < 100000; i++) {
            if (int res=testingMul_ij(max1, max2)) {
                printTestError("Multiplication", max1, max2, i, res);
                return res;
            }
        }
    }
    cout << "Multiple test: OK" << endl;
    return 0;
}